

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

void __thiscall
HumanPlayerStrategy::HumanPlayerStrategy(HumanPlayerStrategy *this,HumanPlayerStrategy *toCopy)

{
  string *this_00;
  allocator<char> local_25 [13];
  HumanPlayerStrategy *local_18;
  HumanPlayerStrategy *toCopy_local;
  HumanPlayerStrategy *this_local;
  
  local_18 = toCopy;
  toCopy_local = this;
  PlayerStrategy::PlayerStrategy(&this->super_PlayerStrategy,&toCopy->super_PlayerStrategy);
  (this->super_PlayerStrategy)._vptr_PlayerStrategy = (_func_int **)&PTR_yesOrNo_0016c918;
  (this->super_PlayerStrategy).exchangingCardType =
       (local_18->super_PlayerStrategy).exchangingCardType;
  (this->super_PlayerStrategy).armiesToPlace = (local_18->super_PlayerStrategy).armiesToPlace;
  (this->super_PlayerStrategy).player = (local_18->super_PlayerStrategy).player;
  (this->super_PlayerStrategy).from = (local_18->super_PlayerStrategy).from;
  (this->super_PlayerStrategy).to = (local_18->super_PlayerStrategy).to;
  this_00 = (string *)operator_new(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"HUMAN",local_25);
  (this->super_PlayerStrategy).strategyName = this_00;
  std::allocator<char>::~allocator(local_25);
  return;
}

Assistant:

HumanPlayerStrategy::HumanPlayerStrategy(const HumanPlayerStrategy& toCopy)  : PlayerStrategy(toCopy) {
    this->exchangingCardType = toCopy.exchangingCardType;
    this->armiesToPlace = toCopy.armiesToPlace;
    this->player = toCopy.player;
    this->from = toCopy.from;
    this->to = toCopy.to;
    this->strategyName = new std::string("HUMAN");
}